

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::aabbTest
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          cbtBroadphaseAabbCallback *callback)

{
  uint uVar1;
  cbtDbvtBroadphase *pcVar2;
  Handle *pHVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  
  pcVar2 = this->m_raycastAccelerator;
  if (pcVar2 != (cbtDbvtBroadphase *)0x0) {
    (*(pcVar2->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[7])
              (pcVar2,aabbMin,aabbMax,callback);
    return;
  }
  uVar4 = this->m_numHandles;
  if ((uVar4 & 0x7fffffff) != 0) {
    uVar7 = 0;
    do {
      if ((this->m_pEdges[0][uVar7 + 1].m_pos & 1) != 0) {
        uVar1 = this->m_pEdges[0][uVar7 + 1].m_handle;
        pHVar3 = this->m_pHandles;
        bVar6 = true;
        if ((aabbMin->m_floats[0] <= pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMax.m_floats[0])
           && (bVar6 = true,
              pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMin.m_floats[0] <= aabbMax->m_floats[0]))
        {
          bVar6 = false;
        }
        bVar5 = true;
        if ((aabbMin->m_floats[2] <= pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMax.m_floats[2])
           && (pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMin.m_floats[2] <= aabbMax->m_floats[2])
           ) {
          bVar5 = bVar6;
        }
        if (aabbMin->m_floats[1] <= pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMax.m_floats[1]) {
          if (!bVar5 && pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMin.m_floats[1] <=
                        aabbMax->m_floats[1]) {
            (*callback->_vptr_cbtBroadphaseAabbCallback[2])(callback);
            uVar4 = this->m_numHandles;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4 * 2);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const cbtVector3& aabbMin, const cbtVector3& aabbMax, cbtBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin, aabbMax, callback);
	}
	else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i = 1; i < m_numHandles * 2 + 1; i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin, aabbMax, handle->m_aabbMin, handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}